

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O0

void gba_handle_event(SDL_Event *event)

{
  int sdlk;
  int *in_RDI;
  _Bool in_stack_fffffffffffffff3;
  _Bool state;
  uint8_t button;
  
  sdlk = *in_RDI;
  if (sdlk == 0x100) {
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  User requested quit\n\x1b[0;m");
    }
    should_quit = true;
  }
  else {
    if (sdlk == 0x300) {
      if (in_RDI[2] == window_id) {
        if (in_RDI[5] == 0x6f) {
          set_dbg_window_visibility(false);
          return;
        }
        update_key(0x300,in_stack_fffffffffffffff3);
        return;
      }
    }
    else if (sdlk != 0x301) {
      if (sdlk == 0x650) {
        update_joyaxis(event._7_1_,event._4_2_);
        return;
      }
      state = SUB41((uint)sdlk >> 0x10,0);
      button = (uint8_t)((uint)sdlk >> 0x18);
      if (sdlk == 0x651) {
        update_joybutton(button,state);
        return;
      }
      if (sdlk == 0x652) {
        update_joybutton(button,state);
        return;
      }
      if (2 < sdlk - 0x653U) {
        return;
      }
      gba_refresh_gamepads();
      return;
    }
    if (in_RDI[2] == window_id) {
      update_key(sdlk,in_stack_fffffffffffffff3);
    }
  }
  return;
}

Assistant:

void gba_handle_event(SDL_Event* event) {
    switch (event->type) {
        case SDL_QUIT:
            logwarn("User requested quit")
            should_quit = true;
            break;
        case SDL_KEYDOWN:
            if (event->key.windowID == window_id) {
                if (event->key.keysym.sym == SDLK_o) {
                    set_dbg_window_visibility(true);
                } else {
                    update_key(event->key.keysym.sym, true);
                }
                break;
            }
        case SDL_KEYUP:
            if (event->key.windowID == window_id) {
                update_key(event->key.keysym.sym, false);
            }
            break;
        case SDL_CONTROLLERDEVICEADDED:
        case SDL_CONTROLLERDEVICEREMOVED:
        case SDL_CONTROLLERDEVICEREMAPPED:
            gba_refresh_gamepads();
            break;
        case SDL_CONTROLLERBUTTONDOWN:
            update_joybutton(event->cbutton.button, true);
            break;
        case SDL_CONTROLLERBUTTONUP:
            update_joybutton(event->cbutton.button, false);
            break;
        case SDL_CONTROLLERAXISMOTION:
            update_joyaxis(event->caxis.axis, event->caxis.value);
            break;
        default:
            break;
    }
}